

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

string * __thiscall cmake::ReportCapabilities_abi_cxx11_(string *__return_storage_ptr__,cmake *this)

{
  size_t in_RCX;
  Value local_a8;
  FastWriter local_80;
  undefined1 local_50 [8];
  FastWriter writer;
  cmake *this_local;
  string *result;
  
  writer._47_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  Json::FastWriter::FastWriter((FastWriter *)local_50);
  ReportCapabilitiesJson(&local_a8,this);
  Json::FastWriter::write_abi_cxx11_(&local_80,(int)local_50,&local_a8,in_RCX);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  Json::Value::~Value(&local_a8);
  writer._47_1_ = 1;
  Json::FastWriter::~FastWriter((FastWriter *)local_50);
  if ((writer._47_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::ReportCapabilities() const
{
  std::string result;
#if defined(CMAKE_BUILD_WITH_CMAKE)
  Json::FastWriter writer;
  result = writer.write(this->ReportCapabilitiesJson());
#else
  result = "Not supported";
#endif
  return result;
}